

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O2

void * __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC>::setIntersection
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC> *this,void *A,void *B)

{
  void *__dest;
  bitset<16000UL> __result;
  _Base_bitset<250UL> local_7f0;
  
  __dest = operator_new(2000);
  memcpy(&local_7f0,A,2000);
  std::_Base_bitset<250UL>::_M_do_and(&local_7f0,(_Base_bitset<250UL> *)B);
  memcpy(__dest,&local_7f0,2000);
  return __dest;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setIntersection(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) & (*__B__);
	return __C__;
}